

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_readCTable
                 (HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                 uint *hasZeroWeights)

{
  U32 UVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  U32 UVar8;
  uint uVar9;
  size_t sStackY_1b0;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [13];
  BYTE huffWeight [256];
  
  tableLog = 0;
  nbSymbols = 0;
  sStackY_1b0 = HUF_readStats(huffWeight,0x100,rankVal,&nbSymbols,&tableLog,src,srcSize);
  if (sStackY_1b0 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(rankVal[0] != 0);
    uVar7 = (ulong)tableLog;
    if (uVar7 < 0xd) {
      uVar6 = (ulong)nbSymbols;
      if (*maxSymbolValuePtr + 1 < nbSymbols) {
        sStackY_1b0 = 0xffffffffffffffd0;
      }
      else {
        *maxSymbolValuePtr = nbSymbols - 1;
        *(char *)CTable = (char)tableLog;
        *(char *)((long)CTable + 1) = (char)(nbSymbols - 1);
        *(undefined4 *)((long)CTable + 2) = 0;
        *(undefined2 *)((long)CTable + 6) = 0;
        UVar8 = 0;
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          UVar1 = rankVal[uVar4 + 1];
          bVar2 = (byte)uVar4;
          rankVal[uVar4 + 1] = UVar8;
          UVar8 = (UVar1 << (bVar2 & 0x1f)) + UVar8;
        }
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          uVar9 = (uint)(byte)(((char)tableLog + '\x01') - huffWeight[uVar4]);
          if (huffWeight[uVar4] == '\0') {
            uVar9 = 0;
          }
          CTable[uVar4 + 1] = (ulong)uVar9;
        }
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0xd] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          nbPerRank[(byte)CTable[uVar4 + 1]] = nbPerRank[(byte)CTable[uVar4 + 1]] + 1;
        }
        valPerRank[uVar7 + 1] = 0;
        uVar3 = 0;
        while (uVar7 != 0) {
          valPerRank[uVar7] = uVar3;
          uVar3 = (ushort)(uVar3 + nbPerRank[uVar7]) >> 1;
          uVar7 = uVar7 - 1;
        }
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          uVar4 = CTable[uVar7 + 1];
          uVar5 = uVar4 & 0xff;
          uVar3 = valPerRank[uVar5];
          valPerRank[uVar5] = uVar3 + 1;
          if (uVar5 != 0) {
            CTable[uVar7 + 1] = (ulong)uVar3 << (-(char)uVar4 & 0x3fU) | uVar4;
          }
        }
      }
    }
    else {
      sStackY_1b0 = 0xffffffffffffffd4;
    }
  }
  return sStackY_1b0;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    *maxSymbolValuePtr = nbSymbols - 1;

    HUF_writeCTableHeader(CTable, tableLog, *maxSymbolValuePtr);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    return readSize;
}